

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O3

void __thiscall
autoSimplification_sumSin_Test::~autoSimplification_sumSin_Test
          (autoSimplification_sumSin_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(autoSimplification, sumSin)
{
    auto const x = symbol("x");
    auto const sinX = sin(x);
    auto const n2 = 2_i;
    auto const e1 = sinX;
    auto const e2 = n2 * sinX;
    auto const e = e1 + e2;
    EXPECT_EQ(toString(e), "(* 3 (Sin x))");
}